

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void __thiscall VmFunction::UpdateDominatorTree(VmFunction *this,VmModule *module,bool clear)

{
  SmallArray<VmBlock_*,_4U> *this_00;
  VmBlock **ppVVar1;
  VmValue **ppVVar2;
  VmBlock *pVVar3;
  VmBlock *curr;
  VmBlock *pVVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  VmBlock *pVVar10;
  VmValue *pVVar11;
  VmBlock *pVVar12;
  VmBlock *pVVar13;
  long lVar14;
  VmBlock *pVVar15;
  VmBlock *curr_1;
  ulong uVar16;
  bool bVar17;
  uint postOrder;
  uint preOrder;
  SmallArray<VmBlock_*,_32U> blocksPostOrder;
  uint local_150;
  uint local_14c;
  SmallArray<VmBlock_*,_32U> local_148;
  
  pVVar4 = this->firstBlock;
  if (pVVar4 != (VmBlock *)0x0) {
    do {
      if (clear) {
        (pVVar4->predecessors).count = 0;
        (pVVar4->successors).count = 0;
      }
      pVVar4->visited = false;
      pVVar4->idom = (VmBlock *)0x0;
      (pVVar4->dominanceFrontier).count = 0;
      (pVVar4->dominanceChildren).count = 0;
      pVVar4 = pVVar4->nextSibling;
    } while (pVVar4 != (VmBlock *)0x0);
    for (pVVar4 = this->firstBlock; pVVar4 != (VmBlock *)0x0; pVVar4 = pVVar4->nextSibling) {
      if ((pVVar4->super_VmValue).users.count != 0) {
        uVar6 = 0;
        do {
          pVVar11 = (pVVar4->super_VmValue).users.data[uVar6];
          if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 2)) {
            pVVar11 = (VmValue *)0x0;
          }
          if ((pVVar11 != (VmValue *)0x0) && (*(int *)&pVVar11[1]._vptr_VmValue != 0x4d)) {
            uVar5 = (pVVar4->predecessors).count;
            if (uVar5 == (pVVar4->predecessors).max) {
              SmallArray<VmBlock_*,_4U>::grow(&pVVar4->predecessors,uVar5);
            }
            ppVVar1 = (pVVar4->predecessors).data;
            if (ppVVar1 == (VmBlock **)0x0) goto LAB_001ab1f9;
            pVVar13 = (VmBlock *)pVVar11[1].users.data;
            uVar5 = (pVVar4->predecessors).count;
            (pVVar4->predecessors).count = uVar5 + 1;
            ppVVar1[uVar5] = pVVar13;
            ppVVar2 = pVVar11[1].users.data;
            if (*(uint *)(ppVVar2 + 0x25) == *(uint *)((long)ppVVar2 + 300)) {
              SmallArray<VmBlock_*,_4U>::grow
                        ((SmallArray<VmBlock_*,_4U> *)(ppVVar2 + 0x24),*(uint *)(ppVVar2 + 0x25));
            }
            ppVVar1 = ((SmallArray<VmBlock_*,_4U> *)(ppVVar2 + 0x24))->data;
            if (ppVVar1 == (VmBlock **)0x0) goto LAB_001ab1f9;
            uVar5 = *(uint *)(ppVVar2 + 0x25);
            *(uint *)(ppVVar2 + 0x25) = uVar5 + 1;
            ppVVar1[uVar5] = pVVar4;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < (pVVar4->super_VmValue).users.count);
      }
    }
    pVVar4 = this->firstBlock;
    pVVar4->idom = pVVar4;
    local_148.allocator = module->allocator;
    local_148.data = local_148.little;
    local_148.count = 0;
    local_148.max = 0x20;
    local_14c = 0;
    local_150 = 0;
    anon_unknown.dwarf_13465d::GetAndNumberControlGraphNodesDfs
              (&local_148,pVVar4,&local_14c,&local_150);
    uVar6 = local_148._8_8_ & 0xffffffff;
    if (1 < uVar6) {
      uVar8 = 0;
      uVar5 = local_148.count;
      do {
        uVar5 = uVar5 - 1;
        if ((local_148.count <= uVar5) || (uVar6 * 8 - uVar8 == 0)) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmBlock *, 32>::operator[](unsigned int) [T = VmBlock *, N = 32]"
                       );
        }
        pVVar4 = *(VmBlock **)((long)local_148.data + uVar8);
        *(VmBlock **)((long)local_148.data + uVar8) = local_148.data[uVar5];
        local_148.data[uVar5] = pVVar4;
        uVar8 = uVar8 + 8;
      } while ((uVar6 * 4 & 0xfffffffffffffff8) != uVar8);
    }
    if (uVar6 != 0) {
      pVVar4 = this->firstBlock;
      do {
        uVar8 = 0;
        bVar7 = false;
        do {
          pVVar13 = local_148.data[uVar8];
          if (pVVar13 != pVVar4) {
            uVar5 = (pVVar13->predecessors).count;
            uVar9 = (ulong)uVar5;
            if (uVar9 == 0) {
              bVar17 = true;
              pVVar10 = (VmBlock *)0x0;
            }
            else {
              lVar14 = 0;
              pVVar10 = (VmBlock *)0x0;
              do {
                pVVar12 = (pVVar13->predecessors).data[lVar14];
                if (pVVar12->idom != (VmBlock *)0x0) {
                  pVVar10 = pVVar12;
                }
                lVar14 = lVar14 + 1;
                bVar17 = pVVar10 == (VmBlock *)0x0;
              } while (((uint)lVar14 < uVar5) && (pVVar10 == (VmBlock *)0x0));
            }
            if (bVar17) {
              __assert_fail("firstProcessed",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x8cc,"void VmFunction::UpdateDominatorTree(VmModule *, bool)");
            }
            pVVar12 = pVVar10;
            if (uVar9 != 0) {
              uVar16 = 0;
              do {
                pVVar15 = (pVVar13->predecessors).data[uVar16];
                pVVar3 = pVVar12;
                if ((pVVar15 != pVVar10) && (pVVar15->idom != (VmBlock *)0x0)) {
                  while (pVVar3 = pVVar15, pVVar15 != pVVar12) {
                    uVar5 = pVVar12->controlGraphPostOrderId;
                    for (; pVVar15->controlGraphPostOrderId < uVar5; pVVar15 = pVVar15->idom) {
                    }
                    while (uVar5 < pVVar15->controlGraphPostOrderId) {
                      pVVar12 = pVVar12->idom;
                      uVar5 = pVVar12->controlGraphPostOrderId;
                    }
                  }
                }
                pVVar12 = pVVar3;
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar9);
            }
            if (pVVar13->idom != pVVar12) {
              pVVar13->idom = pVVar12;
              bVar7 = true;
            }
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar6);
      } while ((uVar6 != 0) && (bVar7));
    }
    pVVar4 = this->firstBlock;
    pVVar4->idom = (VmBlock *)0x0;
    for (; pVVar4 != (VmBlock *)0x0; pVVar4 = pVVar4->nextSibling) {
      if (pVVar4->visited == true) {
        if ((1 < (pVVar4->predecessors).count) && ((pVVar4->predecessors).count != 0)) {
          uVar6 = 0;
          do {
            pVVar13 = (pVVar4->predecessors).data[uVar6];
            if (pVVar13->visited == true) {
              for (; pVVar13 != pVVar4->idom; pVVar13 = pVVar13->idom) {
                this_00 = &pVVar13->dominanceFrontier;
                uVar5 = (pVVar13->dominanceFrontier).count;
                if ((ulong)uVar5 == 0) {
                  bVar7 = false;
                }
                else {
                  uVar8 = 1;
                  bVar7 = false;
                  do {
                    if (this_00->data[uVar8 - 1] == pVVar4) {
                      bVar7 = true;
                    }
                  } while ((uVar8 < uVar5) && (uVar8 = uVar8 + 1, !bVar7));
                }
                if (!bVar7) {
                  if (uVar5 == (pVVar13->dominanceFrontier).max) {
                    SmallArray<VmBlock_*,_4U>::grow(this_00,uVar5);
                  }
                  if (this_00->data == (VmBlock **)0x0) goto LAB_001ab1f9;
                  uVar5 = (pVVar13->dominanceFrontier).count;
                  (pVVar13->dominanceFrontier).count = uVar5 + 1;
                  this_00->data[uVar5] = pVVar4;
                }
              }
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (pVVar4->predecessors).count);
        }
        pVVar13 = pVVar4->idom;
        if (pVVar13 != (VmBlock *)0x0) {
          uVar5 = (pVVar13->dominanceChildren).count;
          if (uVar5 == (pVVar13->dominanceChildren).max) {
            SmallArray<VmBlock_*,_4U>::grow(&pVVar13->dominanceChildren,uVar5);
          }
          ppVVar1 = (pVVar13->dominanceChildren).data;
          if (ppVVar1 == (VmBlock **)0x0) {
LAB_001ab1f9:
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,
                          "void SmallArray<VmBlock *, 4>::push_back(const T &) [T = VmBlock *, N = 4]"
                         );
          }
          uVar5 = (pVVar13->dominanceChildren).count;
          (pVVar13->dominanceChildren).count = uVar5 + 1;
          ppVVar1[uVar5] = pVVar4;
        }
      }
    }
    for (pVVar4 = this->firstBlock; pVVar4 != (VmBlock *)0x0; pVVar4 = pVVar4->nextSibling) {
      pVVar4->visited = false;
    }
    local_14c = 0;
    local_150 = 0;
    anon_unknown.dwarf_13465d::NumberDominanceGraphNodesDfs(this->firstBlock,&local_14c,&local_150);
    SmallArray<VmBlock_*,_32U>::~SmallArray(&local_148);
  }
  return;
}

Assistant:

void VmFunction::UpdateDominatorTree(VmModule *module, bool clear)
{
	if(!firstBlock)
		return;

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(clear)
		{
			curr->predecessors.clear();
			curr->successors.clear();
		}

		curr->visited = false;
		curr->idom = NULL;
		curr->dominanceFrontier.clear();
		curr->dominanceChildren.clear();
	}

	// Get block predecessors and successors
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		for(unsigned i = 0; i < curr->users.size(); i++)
		{
			VmValue *user = curr->users[i];

			if(VmInstruction *inst = getType<VmInstruction>(user))
			{
				if(inst->cmd != VM_INST_PHI)
				{
					curr->predecessors.push_back(inst->parent);
					inst->parent->successors.push_back(curr);
				}
			}
		}
	}

	firstBlock->idom = firstBlock;

	SmallArray<VmBlock*, 32> blocksPostOrder(module->allocator);
	unsigned preOrder = 0;
	unsigned postOrder = 0;

	GetAndNumberControlGraphNodesDfs(blocksPostOrder, firstBlock, preOrder, postOrder);

	// Get nodes in reverse post order
	for(unsigned i = 0; i < blocksPostOrder.size() / 2; i++)
	{
		VmBlock *tmp = blocksPostOrder[i];
		blocksPostOrder[i] = blocksPostOrder[blocksPostOrder.size() - i - 1];
		blocksPostOrder[blocksPostOrder.size() - i - 1] = tmp;
	}

	bool changed = true;

	while(changed)
	{
		changed = false;

		for(unsigned i = 0; i < blocksPostOrder.size(); i++)
		{
			VmBlock *b = blocksPostOrder[i];

			if(b == firstBlock)
				continue;

			VmBlock *firstProcessed = NULL;

			for(unsigned k = 0; k < b->predecessors.size() && !firstProcessed; k++)
			{
				if(b->predecessors[k]->idom)
					firstProcessed = b->predecessors[k];
			}

			assert(firstProcessed);
			VmBlock *newIdom = firstProcessed;

			for(unsigned k = 0; k < b->predecessors.size(); k++)
			{
				VmBlock *p = b->predecessors[k];

				if(p == firstProcessed)
					continue;

				if(p->idom)
					newIdom = BlockIdomIntersect(p, newIdom);
			}

			if(b->idom != newIdom)
			{
				b->idom = newIdom;
				changed = true;
			}
		}
	}

	firstBlock->idom = NULL;

	// Fill the dominance frontier and dominator tree children
	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
	{
		if(!curr->visited)
			continue;

		if(curr->predecessors.size() >= 2)
		{
			for(unsigned i = 0; i < curr->predecessors.size(); i++)
			{
				VmBlock *p = curr->predecessors[i];

				if(!p->visited)
					continue;

				VmBlock *runner = p;

				while(runner != curr->idom)
				{
					bool found = false;
					for(unsigned k = 0; k < runner->dominanceFrontier.size() && !found; k++)
					{
						if(runner->dominanceFrontier[k] == curr)
							found = true;
					}
					if(!found)
						runner->dominanceFrontier.push_back(curr);

					runner = runner->idom;
				}
			}
		}

		if(curr->idom)
			curr->idom->dominanceChildren.push_back(curr);
	}

	for(VmBlock *curr = firstBlock; curr; curr = curr->nextSibling)
		curr->visited = false;

	preOrder = 0;
	postOrder = 0;
	NumberDominanceGraphNodesDfs(firstBlock, preOrder, postOrder);
}